

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_clear(JSON_Array *array)

{
  JSON_Array *pJVar1;
  JSON_Array *in_RDI;
  size_t i;
  JSON_Array *value;
  JSON_Array *array_00;
  JSON_Status local_4;
  
  if (in_RDI == (JSON_Array *)0x0) {
    local_4 = -1;
  }
  else {
    value = (JSON_Array *)0x0;
    while( true ) {
      array_00 = value;
      pJVar1 = (JSON_Array *)json_array_get_count(in_RDI);
      if (pJVar1 <= value) break;
      json_array_get_value(array_00,(size_t)value);
      json_value_free((JSON_Value *)value);
      value = (JSON_Array *)((long)&array_00->wrapping_value + 1);
    }
    in_RDI->count = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

JSON_Status json_array_clear(JSON_Array *array) {
    size_t i = 0;
    if (array == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_array_get_count(array); i++) {
        json_value_free(json_array_get_value(array, i));
    }
    array->count = 0;
    return JSONSuccess;
}